

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

aiMatrix4x4 * __thiscall
Assimp::ColladaParser::CalculateResultTransform
          (aiMatrix4x4 *__return_storage_ptr__,ColladaParser *this,
          vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
          *pTransforms)

{
  float fVar1;
  undefined8 uVar2;
  pointer pTVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float local_88;
  float fStack_84;
  float fStack_64;
  
  __return_storage_ptr__->a1 = 1.0;
  fVar4 = 0.0;
  fVar5 = 0.0;
  fVar7 = 0.0;
  fVar9 = 0.0;
  __return_storage_ptr__->a2 = 0.0;
  __return_storage_ptr__->a3 = 0.0;
  __return_storage_ptr__->a4 = 0.0;
  __return_storage_ptr__->b1 = 0.0;
  __return_storage_ptr__->b2 = 1.0;
  __return_storage_ptr__->b3 = 0.0;
  __return_storage_ptr__->b4 = 0.0;
  __return_storage_ptr__->c1 = 0.0;
  __return_storage_ptr__->c2 = 0.0;
  __return_storage_ptr__->c3 = 1.0;
  __return_storage_ptr__->c4 = 0.0;
  __return_storage_ptr__->d1 = 0.0;
  __return_storage_ptr__->d2 = 0.0;
  __return_storage_ptr__->d3 = 0.0;
  __return_storage_ptr__->d4 = 1.0;
  pTVar3 = (pTransforms->
           super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pTVar3 != (pTransforms->
                super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    fVar36 = 1.0;
    fVar45 = 0.0;
    fVar33 = 0.0;
    fVar42 = 0.0;
    fVar39 = 1.0;
    fVar41 = 0.0;
    fVar43 = 0.0;
    fVar35 = 0.0;
    fVar44 = 1.0;
    fVar31 = 0.0;
    fVar6 = 1.0;
    fVar27 = 0.0;
    do {
      switch(pTVar3->mType) {
      case TF_LOOKAT:
        fVar1 = pTVar3->f[0];
        fVar39 = pTVar3->f[1];
        fVar43 = pTVar3->f[2];
        fVar42 = pTVar3->f[6];
        fVar18 = pTVar3->f[7];
        fVar41 = pTVar3->f[8];
        fVar40 = 1.0 / SQRT(fVar41 * fVar41 + fVar42 * fVar42 + fVar18 * fVar18);
        fVar42 = fVar42 * fVar40;
        fVar18 = fVar18 * fVar40;
        fVar40 = fVar40 * fVar41;
        fVar20 = pTVar3->f[3] - fVar1;
        fVar29 = pTVar3->f[4] - fVar39;
        fVar41 = pTVar3->f[5] - fVar43;
        fVar38 = 1.0 / SQRT(fVar41 * fVar41 + fVar20 * fVar20 + fVar29 * fVar29);
        fVar20 = fVar20 * fVar38;
        fVar29 = fVar29 * fVar38;
        fVar38 = fVar38 * fVar41;
        fVar17 = fVar29 * fVar40 - fVar18 * fVar38;
        fVar15 = fVar38 * fVar42 - fVar40 * fVar20;
        fVar41 = fVar20 * fVar18 - fVar42 * fVar29;
        fVar47 = 1.0 / SQRT(fVar41 * fVar41 + fVar17 * fVar17 + fVar15 * fVar15);
        fVar17 = fVar17 * fVar47;
        fVar15 = fVar15 * fVar47;
        fVar47 = fVar47 * fVar41;
        fVar28 = fVar9 * 0.0 + fVar47 * fVar33 + fVar17 * fVar6 + fVar31 * fVar15;
        fVar29 = -fVar29;
        fStack_64 = -fVar20;
        fVar41 = fVar31 * fVar29;
        fVar38 = -fVar38;
        fVar11 = fVar31 * fVar39;
        fVar16 = fVar33 * fVar43;
        fVar31 = fVar9 * 0.0 + fVar40 * fVar33 + fVar6 * fVar42 + fVar31 * fVar18;
        fVar33 = fVar9 * 0.0 + fVar38 * fVar33 + fVar6 * -fVar20 + fVar41;
        fVar30 = fVar44 * fVar15;
        fVar14 = fVar47 * fVar45;
        fVar41 = fVar29 * fVar44;
        fVar46 = fVar44 * fVar39;
        fVar21 = fVar7 * fVar1;
        fVar32 = fVar45 * fVar43;
        fVar44 = fVar5 * 0.0 + fVar45 * fVar40 + fVar7 * fVar42 + fVar18 * fVar44;
        fVar45 = fVar5 * 0.0 + fVar45 * fVar38 + fVar7 * fStack_64 + fVar41;
        fVar8 = fVar35 * fVar15;
        fVar10 = fVar47 * fVar36;
        fVar41 = fVar35 * fVar29;
        fVar19 = fVar36 * fVar43 + fVar1 * fVar4 + fVar39 * fVar35 + fVar27;
        fVar35 = fVar27 * 0.0 + fVar40 * fVar36 + fVar4 * fVar42 + fVar35 * fVar18;
        fVar36 = fVar27 * 0.0 + fVar38 * fVar36 + fVar4 * fStack_64 + fVar41;
        fVar20 = __return_storage_ptr__->d2;
        fVar12 = __return_storage_ptr__->d1;
        fVar13 = __return_storage_ptr__->d3;
        fVar39 = fVar1 * fVar12 + fVar39 * fVar20 + fVar43 * fVar13 + __return_storage_ptr__->d4;
        fVar43 = __return_storage_ptr__->d4 * 0.0;
        fVar41 = fVar47 * fVar13 + fVar17 * fVar12 + fVar15 * fVar20 + fVar43;
        fVar42 = fVar43 + fVar13 * fVar40 + fVar12 * fVar42 + fVar20 * fVar18;
        fVar43 = fVar43 + fVar13 * fVar38 + fVar12 * fStack_64 + fVar20 * fVar29;
        fVar9 = fVar16 + fVar1 * fVar6 + fVar11 + fVar9;
        fVar4 = fVar27 * 0.0 + fVar10 + fVar17 * fVar4 + fVar8;
        fVar7 = fVar5 * 0.0 + fVar14 + fVar17 * fVar7 + fVar30;
        fVar5 = fVar32 + fVar21 + fVar46 + fVar5;
        break;
      case TF_ROTATE:
        fVar4 = (pTVar3->f[3] * 3.1415927) / 180.0;
        fVar9 = pTVar3->f[0];
        uVar2 = *(undefined8 *)(pTVar3->f + 1);
        fVar8 = cosf(fVar4);
        fVar4 = sinf(fVar4);
        fVar5 = 1.0 - fVar8;
        fVar7 = fVar9 * fVar5;
        fVar10 = fVar7 * fVar9 + fVar8;
        local_88 = (float)uVar2;
        fStack_84 = (float)((ulong)uVar2 >> 0x20);
        fVar6 = fVar5 * local_88;
        fVar11 = fVar7 * local_88 + fStack_84 * fVar4;
        fVar42 = fVar7 * local_88 + -(fStack_84 * fVar4);
        fVar32 = fVar7 * fStack_84 + local_88 * fVar4;
        fVar38 = fVar6 * local_88 + fVar8;
        fVar40 = fVar6 * fStack_84 + -(fVar9 * fVar4);
        fVar30 = fVar7 * fStack_84 - local_88 * fVar4;
        fVar46 = fVar6 * fStack_84 + fVar9 * fVar4;
        fVar8 = fVar5 * fStack_84 * fStack_84 + fVar8;
        fVar9 = __return_storage_ptr__->a1;
        fVar4 = __return_storage_ptr__->a2;
        fVar7 = __return_storage_ptr__->a3;
        fVar33 = __return_storage_ptr__->a4 * 0.0;
        fVar28 = fVar30 * fVar7 + fVar10 * fVar9 + fVar11 * fVar4 + fVar33;
        fVar31 = fVar33 + fVar7 * fVar46 + fVar9 * fVar42 + fVar4 * fVar38;
        fVar33 = fVar33 + fVar7 * fVar8 + fVar9 * fVar32 + fVar4 * fVar40;
        fVar5 = __return_storage_ptr__->b1;
        fVar6 = __return_storage_ptr__->b2;
        fVar27 = __return_storage_ptr__->b3;
        fVar29 = __return_storage_ptr__->b4 * 0.0;
        fVar44 = fVar29 + fVar27 * fVar46 + fVar5 * fVar42 + fVar6 * fVar38;
        fVar45 = fVar29 + fVar27 * fVar8 + fVar5 * fVar32 + fVar6 * fVar40;
        fVar1 = __return_storage_ptr__->c1;
        fVar18 = __return_storage_ptr__->c2;
        fVar20 = __return_storage_ptr__->c3;
        fVar19 = fVar20 * 0.0 + fVar1 * 0.0 + fVar18 * 0.0 + __return_storage_ptr__->c4;
        fVar47 = __return_storage_ptr__->c4 * 0.0;
        fVar35 = fVar47 + fVar20 * fVar46 + fVar1 * fVar42 + fVar18 * fVar38;
        fVar36 = fVar47 + fVar20 * fVar8 + fVar1 * fVar32 + fVar18 * fVar40;
        fVar12 = __return_storage_ptr__->d2;
        fVar13 = __return_storage_ptr__->d1;
        fVar14 = __return_storage_ptr__->d3;
        fVar39 = fVar14 * 0.0 + fVar13 * 0.0 + fVar12 * 0.0 + __return_storage_ptr__->d4;
        fVar43 = __return_storage_ptr__->d4 * 0.0;
        fVar41 = fVar30 * fVar14 + fVar10 * fVar13 + fVar11 * fVar12 + fVar43;
        fVar42 = fVar43 + fVar14 * fVar46 + fVar13 * fVar42 + fVar12 * fVar38;
        fVar43 = fVar43 + fVar14 * fVar8 + fVar13 * fVar32 + fVar12 * fVar40;
        fVar9 = fVar7 * 0.0 + fVar9 * 0.0 + fVar4 * 0.0 + __return_storage_ptr__->a4;
        fVar4 = fVar30 * fVar20 + fVar10 * fVar1 + fVar11 * fVar18 + fVar47;
        fVar7 = fVar30 * fVar27 + fVar10 * fVar5 + fVar11 * fVar6 + fVar29;
        fVar5 = fVar27 * 0.0 + fVar5 * 0.0 + fVar6 * 0.0 + __return_storage_ptr__->b4;
        break;
      case TF_TRANSLATE:
        fVar1 = pTVar3->f[0];
        fVar18 = pTVar3->f[1];
        fVar20 = pTVar3->f[2];
        fVar12 = fVar31 * 0.0;
        fVar30 = fVar31 * fVar18;
        fVar40 = fVar33 * fVar20;
        fVar28 = fVar9 * 0.0 + fVar6 + fVar12 + fVar33 * 0.0;
        fVar31 = fVar9 * 0.0 + fVar6 * 0.0 + fVar31 + fVar33 * 0.0;
        fVar33 = fVar9 * 0.0 + fVar6 * 0.0 + fVar12 + fVar33;
        fVar8 = fVar44 * 0.0;
        fVar46 = fVar45 * 0.0;
        fVar10 = fVar1 * fVar7;
        fVar13 = fVar44 * fVar18;
        fVar38 = fVar45 * fVar20;
        fVar44 = fVar5 * 0.0 + fVar7 * 0.0 + fVar44 + fVar46;
        fVar45 = fVar5 * 0.0 + fVar7 * 0.0 + fVar8 + fVar45;
        fVar12 = fVar35 * 0.0;
        fVar14 = fVar36 * 0.0;
        fVar19 = fVar36 * fVar20 + fVar35 * fVar18 + fVar1 * fVar4 + fVar27;
        fVar35 = fVar27 * 0.0 + fVar4 * 0.0 + fVar35 + fVar14;
        fVar36 = fVar27 * 0.0 + fVar4 * 0.0 + fVar12 + fVar36;
        fVar32 = fVar1 * fVar41;
        fVar29 = fVar41 * 0.0;
        fVar18 = fVar18 * fVar42;
        fVar11 = fVar42 * 0.0;
        fVar41 = fVar39 * 0.0 + fVar41 + fVar11 + fVar43 * 0.0;
        fVar20 = fVar43 * fVar20;
        fVar42 = fVar39 * 0.0 + fVar29 + fVar42 + fVar43 * 0.0;
        fVar43 = fVar39 * 0.0 + fVar29 + fVar11 + fVar43;
        fVar9 = fVar40 + fVar1 * fVar6 + fVar30 + fVar9;
        fVar4 = fVar27 * 0.0 + fVar4 + fVar12 + fVar14;
        fVar39 = fVar20 + fVar18 + fVar32 + fVar39;
        fVar7 = fVar5 * 0.0 + fVar7 + fVar8 + fVar46;
        fVar5 = fVar38 + fVar13 + fVar10 + fVar5;
        break;
      case TF_SCALE:
        fVar1 = pTVar3->f[0];
        fVar18 = pTVar3->f[1];
        fVar12 = fVar6 * 0.0 + fVar31 * 0.0;
        fVar29 = fVar33 * 0.0;
        fVar20 = pTVar3->f[2];
        fVar28 = fVar9 * 0.0 + fVar1 * fVar6 + fVar31 * 0.0 + fVar29;
        fVar31 = fVar9 * 0.0 + fVar33 * 0.0 + fVar6 * 0.0 + fVar31 * fVar18;
        fVar33 = fVar9 * 0.0 + fVar33 * fVar20 + fVar12;
        fVar14 = fVar44 * 0.0;
        fVar8 = fVar7 * 0.0 + fVar14;
        fVar13 = fVar45 * 0.0;
        fVar44 = fVar5 * 0.0 + fVar45 * 0.0 + fVar7 * 0.0 + fVar44 * fVar18;
        fVar45 = fVar5 * 0.0 + fVar45 * fVar20 + fVar8;
        fVar32 = fVar35 * 0.0;
        fVar6 = fVar4 * 0.0 + fVar32;
        fVar11 = fVar36 * 0.0;
        fVar35 = fVar27 * 0.0 + fVar36 * 0.0 + fVar4 * 0.0 + fVar35 * fVar18;
        fVar36 = fVar27 * 0.0 + fVar20 * fVar36 + fVar6;
        fVar19 = fVar6 + fVar11 + fVar27;
        fVar6 = fVar41 * 0.0;
        fVar10 = fVar6 + fVar42 * 0.0;
        fVar30 = fVar43 * 0.0;
        fVar41 = fVar39 * 0.0 + fVar1 * fVar41 + fVar42 * 0.0 + fVar30;
        fVar42 = fVar39 * 0.0 + fVar43 * 0.0 + fVar6 + fVar42 * fVar18;
        fVar43 = fVar39 * 0.0 + fVar20 * fVar43 + fVar10;
        fVar9 = fVar12 + fVar29 + fVar9;
        fVar4 = fVar27 * 0.0 + fVar1 * fVar4 + fVar32 + fVar11;
        fVar39 = fVar10 + fVar30 + fVar39;
        fVar7 = fVar5 * 0.0 + fVar1 * fVar7 + fVar14 + fVar13;
        fVar5 = fVar8 + fVar13 + fVar5;
        break;
      case TF_SKEW:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.cpp"
                      ,0xd23,
                      "aiMatrix4x4 Assimp::ColladaParser::CalculateResultTransform(const std::vector<Transform> &) const"
                     );
      case TF_MATRIX:
        fVar1 = pTVar3->f[0];
        fVar18 = pTVar3->f[1];
        fVar20 = pTVar3->f[2];
        fVar12 = pTVar3->f[3];
        fVar13 = pTVar3->f[4];
        fVar14 = pTVar3->f[5];
        fVar8 = pTVar3->f[6];
        fVar10 = pTVar3->f[7];
        fVar29 = pTVar3->f[8];
        fVar30 = pTVar3->f[9];
        fVar32 = pTVar3->f[10];
        fVar11 = pTVar3->f[0xb];
        fVar38 = pTVar3->f[0xc];
        fVar40 = pTVar3->f[0xd];
        fVar46 = pTVar3->f[0xe];
        fVar47 = pTVar3->f[0xf];
        fVar19 = fVar31 * fVar8;
        fVar21 = fVar31 * fVar10;
        fVar22 = fVar33 * fVar11;
        fVar28 = fVar9 * fVar38 + fVar33 * fVar29 + fVar6 * fVar1 + fVar31 * fVar13;
        fVar31 = fVar9 * fVar40 + fVar33 * fVar30 + fVar6 * fVar18 + fVar31 * fVar14;
        fVar33 = fVar9 * fVar46 + fVar33 * fVar32 + fVar6 * fVar20 + fVar19;
        fVar15 = fVar44 * fVar13;
        fVar19 = fVar44 * fVar8;
        fVar23 = fVar44 * fVar10;
        fVar26 = fVar7 * fVar12;
        fVar16 = fVar45 * fVar29;
        fVar24 = fVar45 * fVar11;
        fVar44 = fVar5 * fVar40 + fVar45 * fVar30 + fVar7 * fVar18 + fVar44 * fVar14;
        fVar45 = fVar5 * fVar46 + fVar45 * fVar32 + fVar7 * fVar20 + fVar19;
        fVar17 = fVar35 * fVar13;
        fVar19 = fVar35 * fVar8;
        fVar25 = fVar35 * fVar10;
        fVar34 = fVar36 * fVar29;
        fVar37 = fVar36 * fVar11;
        fVar35 = fVar36 * fVar30 + fVar4 * fVar18 + fVar35 * fVar14 + fVar27 * fVar40;
        fVar36 = fVar36 * fVar32 + fVar4 * fVar20 + fVar19 + fVar27 * fVar46;
        fVar19 = fVar37 + fVar4 * fVar12 + fVar25 + fVar27 * fVar47;
        fVar8 = fVar42 * fVar8;
        fVar10 = fVar42 * fVar10;
        fVar18 = fVar41 * fVar18;
        fVar20 = fVar41 * fVar20;
        fVar25 = fVar41 * fVar12;
        fVar11 = fVar43 * fVar11;
        fVar41 = fVar39 * fVar38 + fVar43 * fVar29 + fVar41 * fVar1 + fVar42 * fVar13;
        fVar42 = fVar39 * fVar40 + fVar43 * fVar30 + fVar18 + fVar42 * fVar14;
        fVar43 = fVar39 * fVar46 + fVar43 * fVar32 + fVar20 + fVar8;
        fVar9 = fVar9 * fVar47 + fVar22 + fVar6 * fVar12 + fVar21;
        fVar4 = fVar34 + fVar4 * fVar1 + fVar17 + fVar27 * fVar38;
        fVar39 = fVar39 * fVar47 + fVar11 + fVar25 + fVar10;
        fVar7 = fVar5 * fVar38 + fVar16 + fVar7 * fVar1 + fVar15;
        fVar5 = fVar5 * fVar47 + fVar24 + fVar26 + fVar23;
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.cpp"
                      ,0xd2d,
                      "aiMatrix4x4 Assimp::ColladaParser::CalculateResultTransform(const std::vector<Transform> &) const"
                     );
      }
      __return_storage_ptr__->a1 = fVar28;
      __return_storage_ptr__->a2 = fVar31;
      __return_storage_ptr__->a3 = fVar33;
      __return_storage_ptr__->a4 = fVar9;
      __return_storage_ptr__->b1 = fVar7;
      __return_storage_ptr__->b2 = fVar44;
      __return_storage_ptr__->b3 = fVar45;
      __return_storage_ptr__->b4 = fVar5;
      __return_storage_ptr__->c1 = fVar4;
      __return_storage_ptr__->c2 = fVar35;
      __return_storage_ptr__->c3 = fVar36;
      __return_storage_ptr__->c4 = fVar19;
      __return_storage_ptr__->d1 = fVar41;
      __return_storage_ptr__->d2 = fVar42;
      __return_storage_ptr__->d3 = fVar43;
      __return_storage_ptr__->d4 = fVar39;
      pTVar3 = pTVar3 + 1;
      fVar6 = fVar28;
      fVar27 = fVar19;
    } while (pTVar3 != (pTransforms->
                       super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 ColladaParser::CalculateResultTransform(const std::vector<Transform>& pTransforms) const
{
    aiMatrix4x4 res;

    for (std::vector<Transform>::const_iterator it = pTransforms.begin(); it != pTransforms.end(); ++it)
    {
        const Transform& tf = *it;
        switch (tf.mType)
        {
        case TF_LOOKAT:
        {
            aiVector3D pos(tf.f[0], tf.f[1], tf.f[2]);
            aiVector3D dstPos(tf.f[3], tf.f[4], tf.f[5]);
            aiVector3D up = aiVector3D(tf.f[6], tf.f[7], tf.f[8]).Normalize();
            aiVector3D dir = aiVector3D(dstPos - pos).Normalize();
            aiVector3D right = (dir ^ up).Normalize();

            res *= aiMatrix4x4(
                right.x, up.x, -dir.x, pos.x,
                right.y, up.y, -dir.y, pos.y,
                right.z, up.z, -dir.z, pos.z,
                0, 0, 0, 1);
            break;
        }
        case TF_ROTATE:
        {
            aiMatrix4x4 rot;
            ai_real angle = tf.f[3] * ai_real(AI_MATH_PI) / ai_real(180.0);
            aiVector3D axis(tf.f[0], tf.f[1], tf.f[2]);
            aiMatrix4x4::Rotation(angle, axis, rot);
            res *= rot;
            break;
        }
        case TF_TRANSLATE:
        {
            aiMatrix4x4 trans;
            aiMatrix4x4::Translation(aiVector3D(tf.f[0], tf.f[1], tf.f[2]), trans);
            res *= trans;
            break;
        }
        case TF_SCALE:
        {
            aiMatrix4x4 scale(tf.f[0], 0.0f, 0.0f, 0.0f, 0.0f, tf.f[1], 0.0f, 0.0f, 0.0f, 0.0f, tf.f[2], 0.0f,
                0.0f, 0.0f, 0.0f, 1.0f);
            res *= scale;
            break;
        }
        case TF_SKEW:
            // TODO: (thom)
            ai_assert(false);
            break;
        case TF_MATRIX:
        {
            aiMatrix4x4 mat(tf.f[0], tf.f[1], tf.f[2], tf.f[3], tf.f[4], tf.f[5], tf.f[6], tf.f[7],
                tf.f[8], tf.f[9], tf.f[10], tf.f[11], tf.f[12], tf.f[13], tf.f[14], tf.f[15]);
            res *= mat;
            break;
        }
        default:
            ai_assert(false);
            break;
        }
    }

    return res;
}